

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ushort uVar1;
  CommentInfo *pCVar2;
  ptrdiff_t pVar3;
  ptrdiff_t pVar4;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ushort uVar5;
  ArrayIndex AVar6;
  char *pcVar7;
  anon_union_4_2_4572b0f8_for_CZString_1 aVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  pVar9;
  ostringstream oss;
  string local_1f0;
  undefined1 local_1d0 [16];
  char local_1c0 [360];
  ValueHolder local_58;
  ushort local_50;
  undefined2 uStack_4e;
  CommentInfo *local_48;
  ptrdiff_t pStack_40;
  ptrdiff_t local_38;
  
  uVar1 = *(ushort *)&this->field_0x8;
  if ((char)uVar1 == '\0') {
    uVar5 = (ushort)_local_50 & 0xfe00;
    local_48 = (CommentInfo *)0x0;
    pStack_40 = 0;
    local_38 = 0;
    local_50 = uVar5 + 6;
    pcVar7 = (char *)operator_new(0x30);
    pcVar7[0x10] = '\0';
    pcVar7[0x11] = '\0';
    pcVar7[0x12] = '\0';
    pcVar7[0x13] = '\0';
    pcVar7[0x14] = '\0';
    pcVar7[0x15] = '\0';
    pcVar7[0x16] = '\0';
    pcVar7[0x17] = '\0';
    pcVar7[0x18] = '\0';
    pcVar7[0x19] = '\0';
    pcVar7[0x1a] = '\0';
    pcVar7[0x1b] = '\0';
    pcVar7[0x1c] = '\0';
    pcVar7[0x1d] = '\0';
    pcVar7[0x1e] = '\0';
    pcVar7[0x1f] = '\0';
    pcVar7[0x20] = '\0';
    pcVar7[0x21] = '\0';
    pcVar7[0x22] = '\0';
    pcVar7[0x23] = '\0';
    pcVar7[0x24] = '\0';
    pcVar7[0x25] = '\0';
    pcVar7[0x26] = '\0';
    pcVar7[0x27] = '\0';
    pcVar7[0x28] = '\0';
    pcVar7[0x29] = '\0';
    pcVar7[0x2a] = '\0';
    pcVar7[0x2b] = '\0';
    pcVar7[0x2c] = '\0';
    pcVar7[0x2d] = '\0';
    pcVar7[0x2e] = '\0';
    pcVar7[0x2f] = '\0';
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    pcVar7[8] = '\0';
    pcVar7[9] = '\0';
    pcVar7[10] = '\0';
    pcVar7[0xb] = '\0';
    pcVar7[0xc] = '\0';
    pcVar7[0xd] = '\0';
    pcVar7[0xe] = '\0';
    pcVar7[0xf] = '\0';
    *(char **)(pcVar7 + 0x18) = pcVar7 + 8;
    *(char **)(pcVar7 + 0x20) = pcVar7 + 8;
    pcVar7[0x28] = '\0';
    pcVar7[0x29] = '\0';
    pcVar7[0x2a] = '\0';
    pcVar7[0x2b] = '\0';
    pcVar7[0x2c] = '\0';
    pcVar7[0x2d] = '\0';
    pcVar7[0x2e] = '\0';
    pcVar7[0x2f] = '\0';
    *(ushort *)&this->field_0x8 = uVar1 & 0xff00 | 6;
    local_58 = this->value_;
    (this->value_).string_ = pcVar7;
    *(ushort *)&this->field_0x8 = uVar1 & 0xfe00 | 6;
    _local_50 = CONCAT22(uStack_4e,uVar1 & 0x100 | uVar5);
    pCVar2 = this->comments_;
    this->comments_ = local_48;
    pVar3 = this->start_;
    this->start_ = pStack_40;
    pVar4 = this->limit_;
    this->limit_ = local_38;
    local_48 = pCVar2;
    pStack_40 = pVar3;
    local_38 = pVar4;
    ~Value((Value *)&local_58);
  }
  else if ((char)uVar1 != '\x06') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,"in Json::Value::resize(): requires arrayValue",0x2d);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1f0);
  }
  AVar6 = size(this);
  if (newSize == 0) {
    clear(this);
    return;
  }
  if (AVar6 < newSize) {
    operator[](this,newSize - 1);
    return;
  }
  if (newSize < AVar6) {
    aVar8.index_ = newSize;
    do {
      this_00 = &((this->value_).map_)->_M_t;
      local_1d0._0_8_ = (char *)0x0;
      local_1d0._8_4_ = aVar8;
      pVar9 = std::
              _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::equal_range(this_00,(key_type *)local_1d0);
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::_M_erase_aux(this_00,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
      if (((char *)local_1d0._0_8_ != (char *)0x0) && ((local_1d0._8_4_ & 3) == 1)) {
        free((void *)local_1d0._0_8_);
      }
      aVar8.index_ = aVar8.index_ + 1;
    } while (AVar6 != aVar8.index_);
  }
  AVar6 = size(this);
  if (AVar6 == newSize) {
    return;
  }
  local_1d0._0_8_ = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"assert json failed","");
  throwLogicError((string *)local_1d0);
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    JSON_ASSERT(size() == newSize);
  }
}